

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAXMLScanner.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSAXMLScanner::switchGrammar(XSAXMLScanner *this,XMLCh *uriStr,bool laxValidate)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLValidator *pXVar3;
  int iVar4;
  XMLCh *pXVar5;
  SchemaGrammar *pSVar6;
  XMLCh *pXVar7;
  
  if (uriStr == L"http://www.w3.org/2001/XMLSchema") {
LAB_002c2fa3:
    pSVar6 = (this->super_SGXMLScanner).fSchemaGrammar;
  }
  else {
    pXVar5 = L"http://www.w3.org/2001/XMLSchema";
    pXVar7 = uriStr;
    if (uriStr == (XMLCh *)0x0) {
LAB_002c2f89:
      if (*pXVar5 == L'\0') goto LAB_002c2fa3;
    }
    else {
      do {
        XVar1 = *pXVar7;
        if (XVar1 == L'\0') goto LAB_002c2f89;
        XVar2 = *pXVar5;
        pXVar5 = pXVar5 + 1;
        pXVar7 = pXVar7 + 1;
      } while (XVar1 == XVar2);
    }
    pSVar6 = (SchemaGrammar *)
             GrammarResolver::getGrammar
                       ((this->super_SGXMLScanner).super_XMLScanner.fGrammarResolver,uriStr);
  }
  if ((pSVar6 != (SchemaGrammar *)0x0) &&
     (iVar4 = (*(pSVar6->super_Grammar).super_XSerializable._vptr_XSerializable[5])(pSVar6),
     iVar4 == 1)) {
    (this->super_SGXMLScanner).super_XMLScanner.fGrammar = &pSVar6->super_Grammar;
    (this->super_SGXMLScanner).fGrammarType = SchemaGrammarType;
    pXVar3 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
    (*pXVar3->_vptr_XMLValidator[0xb])(pXVar3,pSVar6);
    return;
  }
  if (!laxValidate) {
    XMLValidator::emitError
              ((this->super_SGXMLScanner).super_XMLScanner.fValidator,GrammarNotFound,uriStr,
               (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    return;
  }
  return;
}

Assistant:

void XSAXMLScanner::switchGrammar( const XMLCh* const uriStr
                                 , bool laxValidate)
{
    Grammar* tempGrammar = 0;

    if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
        tempGrammar = fSchemaGrammar;
    }
    else {
        tempGrammar = fGrammarResolver->getGrammar(uriStr);
    }

    if (tempGrammar && tempGrammar->getGrammarType() == Grammar::SchemaGrammarType)
    {
        fGrammar = tempGrammar;
        fGrammarType = Grammar::SchemaGrammarType;
        fValidator->setGrammar(fGrammar);
    }
    else if(!laxValidate) {
        fValidator->emitError(XMLValid::GrammarNotFound, uriStr);
    }
}